

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14InvalidcRLIssuerTest31<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section14InvalidcRLIssuerTest31
          (Section14InvalidcRLIssuerTest31<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14InvalidcRLIssuerTest31) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "indirectCRLCA5Cert", "indirectCRLCA6Cert",
                               "InvalidcRLIssuerTest31EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "indirectCRLCA5CRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.31";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}